

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkFragmentShadingRateAttachmentInfoKHR *create_info,ScratchAllocator *alloc)

{
  bool bVar1;
  VkFragmentShadingRateAttachmentInfoKHR *pVVar2;
  VkAttachmentReference2 *pVVar3;
  VkFragmentShadingRateAttachmentInfoKHR *pVVar4;
  
  pVVar2 = copy<VkFragmentShadingRateAttachmentInfoKHR>(this,create_info,1,alloc);
  pVVar4 = pVVar2;
  if (pVVar2->pFragmentShadingRateAttachment != (VkAttachmentReference2 *)0x0) {
    pVVar3 = copy<VkAttachmentReference2>(this,pVVar2->pFragmentShadingRateAttachment,1,alloc);
    bVar1 = copy_pnext_chain(this,pVVar3->pNext,alloc,&pVVar3->pNext,(DynamicStateInfo *)0x0,0);
    pVVar4 = (VkFragmentShadingRateAttachmentInfoKHR *)0x0;
    if (bVar1) {
      pVVar2->pFragmentShadingRateAttachment = pVVar3;
      pVVar4 = pVVar2;
    }
  }
  return pVVar4;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkFragmentShadingRateAttachmentInfoKHR *create_info,
                                             ScratchAllocator &alloc)
{
	auto *resolve = copy(create_info, 1, alloc);
	if (resolve->pFragmentShadingRateAttachment)
	{
		auto *att = copy(resolve->pFragmentShadingRateAttachment, 1, alloc);
		if (!copy_pnext_chain(att->pNext, alloc, &att->pNext, nullptr, 0))
			return nullptr;
		resolve->pFragmentShadingRateAttachment = att;
	}

	return resolve;
}